

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.hpp
# Opt level: O3

void BruteForceTexture(int x,int y,int samps)

{
  undefined1 auVar1 [16];
  iterator iVar2;
  int iVar3;
  uint uVar4;
  clock_t cVar5;
  uint uVar6;
  pair<Vector,_Vector> *elem;
  long lVar7;
  pair<Vector,_Vector> *ppVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  float fVar13;
  double dVar14;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar17 [16];
  double dVar21;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined8 uVar26;
  float fVar27;
  vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_> _filter_elems;
  PosFilter filter;
  pair<Vector,_Vector> *local_138;
  iterator iStack_130;
  pair<Vector,_Vector> *local_128;
  float local_11c;
  double local_118;
  double dStack_110;
  double local_108;
  undefined8 uStack_100;
  PosFilter local_f8;
  Random local_c0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  undefined8 uStack_70;
  undefined1 local_68 [40];
  double local_40;
  
  local_118 = 0.0;
  dStack_110 = 0.0;
  local_138 = (pair<Vector,_Vector> *)0x0;
  iStack_130._M_current = (pair<Vector,_Vector> *)0x0;
  local_128 = (pair<Vector,_Vector> *)0x0;
  iVar3 = std::thread::hardware_concurrency();
  if (0 < iVar3) {
    local_a8 = (double)CONCAT44((float)y,(float)x);
    uStack_a0 = 0;
    iVar11 = 0;
    dStack_110 = 1.0;
    do {
      cVar5 = clock();
      uVar4 = (int)cVar5 * iVar3 + iVar11;
      uVar6 = uVar4 / 0x7fffffff << 0x1f | uVar4 / 0x7fffffff;
      local_c0._gen._M_x = (unsigned_long)(uVar6 + uVar4 + (uint)(uVar4 + uVar6 == 0));
      local_c0._dist._M_param._M_a = local_118;
      local_c0._dist._M_param._M_b = dStack_110;
      uVar10 = (long)samps / (long)iVar3 & 0xffffffff;
      if (0 < (int)((long)samps / (long)iVar3)) {
        do {
          local_108 = std::
                      generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                (&local_c0._gen);
          local_98 = local_c0._dist._M_param._M_b;
          uStack_90 = 0;
          local_88 = local_c0._dist._M_param._M_a;
          dStack_80 = local_c0._dist._M_param._M_b;
          uStack_100 = extraout_XMM0_Qb;
          dVar14 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                             (&local_c0._gen);
          auVar15._0_4_ = (float)(local_108 * (local_98 - local_88) + local_88) + (float)local_a8;
          auVar15._4_4_ =
               (float)(dVar14 * (local_c0._dist._M_param._M_b - local_c0._dist._M_param._M_a) +
                      local_c0._dist._M_param._M_a) + local_a8._4_4_;
          auVar15._8_4_ = (float)uStack_a0 + 0.0;
          auVar15._12_4_ = uStack_a0._4_4_ + 0.0;
          auVar17._0_4_ = (float)width;
          auVar17._4_4_ = (float)height;
          auVar17._8_8_ = 0;
          auVar15 = divps(auVar15,auVar17);
          dVar14 = (double)auVar15._0_4_ + -0.5;
          dVar21 = (double)auVar15._4_4_ + -0.5;
          local_40 = cy.z * dVar21 + cx.z * dVar14 + cam.d.z;
          local_68._16_8_ = cam.o.z;
          local_68._0_8_ = cam.o.x;
          local_68._8_8_ = cam.o.y;
          auVar23._0_8_ = cam.d.x + dVar21 * cy.x + dVar14 * cx.x;
          auVar23._8_8_ = cam.d.y + dVar21 * cy.y + dVar14 * cx.y;
          auVar18._0_8_ =
               SQRT(local_40 * local_40 +
                    auVar23._0_8_ * auVar23._0_8_ + auVar23._8_8_ * auVar23._8_8_);
          local_40 = local_40 / auVar18._0_8_;
          auVar18._8_8_ = auVar18._0_8_;
          local_68._24_16_ = divpd(auVar23,auVar18);
          indirect_filter(&local_f8,(Ray *)local_68,&local_c0,0,1);
          if (iStack_130._M_current == local_128) {
            std::vector<std::pair<Vector,Vector>,std::allocator<std::pair<Vector,Vector>>>::
            _M_realloc_insert<std::pair<Vector,Vector>const&>
                      ((vector<std::pair<Vector,Vector>,std::allocator<std::pair<Vector,Vector>>> *)
                       &local_138,iStack_130,&local_f8);
          }
          else {
            auVar1._8_8_ = local_f8.second.x;
            auVar1._0_8_ = local_f8.first.z;
            ((iStack_130._M_current)->second).y = local_f8.second.y;
            ((iStack_130._M_current)->second).z = local_f8.second.z;
            *(undefined1 (*) [16])&((iStack_130._M_current)->first).z = auVar1;
            ((iStack_130._M_current)->first).x = local_f8.first.x;
            ((iStack_130._M_current)->first).y = local_f8.first.y;
            iStack_130._M_current = iStack_130._M_current + 1;
          }
          uVar4 = (int)uVar10 - 1;
          uVar10 = (ulong)uVar4;
        } while (uVar4 != 0);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar3);
  }
  if (height < 1) {
    fVar22 = 0.0;
  }
  else {
    fVar22 = 0.0;
    iVar9 = 0;
    iVar3 = height;
    iVar11 = width;
    do {
      if (iVar11 < 1) {
        fVar27 = 0.0;
        fVar13 = fVar22;
      }
      else {
        local_78 = (double)iVar9 + 0.5;
        uStack_70 = 0;
        fVar27 = 0.0;
        uVar4 = 0;
        local_11c = fVar22;
        do {
          auVar19._0_8_ = (double)(int)uVar4 + 0.5;
          auVar16._0_8_ = (double)iVar11;
          auVar16._8_8_ = (double)height;
          auVar19._8_8_ = local_78;
          auVar15 = divpd(auVar19,auVar16);
          dVar14 = auVar15._0_8_ + -0.5;
          dVar21 = auVar15._8_8_ + -0.5;
          local_f8.second.z = cy.z * dVar21 + cx.z * dVar14 + cam.d.z;
          local_f8.first.z = cam.o.z;
          local_f8.first.x = cam.o.x;
          local_f8.first.y = cam.o.y;
          auVar24._0_8_ = cam.d.x + dVar21 * cy.x + dVar14 * cx.x;
          auVar24._8_8_ = cam.d.y + dVar21 * cy.y + dVar14 * cx.y;
          auVar20._0_8_ =
               SQRT(local_f8.second.z * local_f8.second.z +
                    auVar24._0_8_ * auVar24._0_8_ + auVar24._8_8_ * auVar24._8_8_);
          local_f8.second.z = local_f8.second.z / auVar20._0_8_;
          auVar20._8_8_ = auVar20._0_8_;
          auVar15 = divpd(auVar24,auVar20);
          local_f8.second.x = auVar15._0_8_;
          local_f8.second.y = auVar15._8_8_;
          iVar3 = (int)((long)spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                              super__Vector_impl_data._M_start >> 4) * -0x49249249;
          if (iVar3 != 0) {
            iVar11 = height * (iVar11 + ~uVar4) + iVar9;
            lVar12 = (long)iVar3;
            dVar14 = 1e+20;
            uVar26 = 0;
            lVar7 = lVar12 * 0x70;
            do {
              lVar12 = lVar12 + -1;
              local_108 = dVar14;
              uStack_100 = uVar26;
              dVar14 = Sphere::Intersect((Sphere *)
                                         ((long)&spheres.
                                                 super__Vector_base<Sphere,_std::allocator<Sphere>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].c.x +
                                         lVar7),(Ray *)&local_f8);
              iVar2._M_current = iStack_130._M_current;
              uVar26 = extraout_XMM0_Qb_00;
              if (local_108 <= dVar14 || dVar14 == 0.0) {
                dVar14 = local_108;
                uVar26 = uStack_100;
              }
              lVar7 = lVar7 + -0x70;
            } while ((int)lVar12 != 0);
            if (dVar14 < 1e+20) {
              if (local_138 == iStack_130._M_current) {
                fVar22 = 0.0;
              }
              else {
                local_a8 = local_f8.second.x * dVar14 + local_f8.first.x;
                local_118 = local_f8.second.y * dVar14 + local_f8.first.y;
                local_98 = dVar14 * local_f8.second.z + local_f8.first.z;
                fVar22 = 0.0;
                ppVar8 = local_138;
                uStack_90 = uVar26;
                do {
                  local_108 = (double)CONCAT44(local_108._4_4_,fVar22);
                  dVar14 = local_a8 - (ppVar8->first).x;
                  dVar21 = local_118 - (ppVar8->first).y;
                  dVar25 = local_98 - (ppVar8->first).z;
                  dVar14 = SQRT(dVar25 * dVar25 + dVar14 * dVar14 + dVar21 * dVar21) /
                           (double)filterRadius;
                  local_88 = (double)(0.3989423 / filterRadius);
                  dVar14 = exp(dVar14 * dVar14 * -0.5);
                  fVar22 = (float)(dVar14 * local_88 * (ppVar8->second).x + (double)local_108._0_4_)
                  ;
                  ppVar8 = ppVar8 + 1;
                } while (ppVar8 != iVar2._M_current);
                fVar22 = fVar22 * 20.0;
              }
              fVar22 = ((float)(nPassesFilter * samps) * ref_img[iVar11] + fVar22) /
                       (float)((nPassesFilter + 1) * samps);
              ref_img[iVar11] = fVar22;
              if (fVar27 <= fVar22) {
                fVar27 = fVar22;
              }
            }
          }
          uVar4 = uVar4 + 1;
          iVar3 = height;
          iVar11 = width;
          fVar13 = local_11c;
        } while ((int)uVar4 < width);
      }
      fVar22 = fVar27;
      if (fVar27 <= fVar13) {
        fVar22 = fVar13;
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < iVar3);
  }
  ref_scale = 1.0 / fVar22;
  dVar14 = ((double)nPassesFilter + 0.8) / ((double)nPassesFilter + 1.0);
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  filterRadius = (float)((double)filterRadius * dVar14);
  nPassesFilter = nPassesFilter + 1;
  if (local_138 != (pair<Vector,_Vector> *)0x0) {
    operator_delete(local_138,(long)local_128 - (long)local_138);
  }
  return;
}

Assistant:

void BruteForceTexture(int x, int y, int samps = 1000) {

   std::vector<PosFilter> _filter_elems;

   // Sub pixel sampling
   const int nthread = std::thread::hardware_concurrency();
   #pragma omp parallel for schedule(dynamic, 1)
   for(int t=0; t<nthread; ++t) {
      Random rng(t + nthread*clock());

      for(int s=0; s<samps/nthread; s++){

         // Create the RNG and get the sub-pixel sample
         float dx = rng();
         float dy = rng();

         // Generate the pixel direction
         Vector d = cx*((dx + x)/width  - .5) +
                    cy*((dy + y)/height - .5) + cam.d;
         d.Normalize();

         // Evaluate the Covariance and Radiance at the pixel location
         const auto filter = indirect_filter(Ray(cam.o, d), rng, 0, 1);
         #pragma omp critical
         {
            _filter_elems.push_back(filter);
         }
      }
   }

   // Loop over the rows and columns of the image and evaluate radiance and
   // covariance per pixel using Monte-Carlo.
   float max_ref = 0.0f;
   #pragma omp parallel for schedule(dynamic, 1), shared(max_ref)
   for (int y=0; y<height; y++){
      float max_temp = 0.0f;

      for (int x=0; x<width; x++) {
         int i=(width-x-1)*height+y;
         float _r = 0.0f;

         // Generate the pixel direction
         Vector d = cx*((0.5 + x)/width  - .5) +
                    cy*((0.5 + y)/height - .5) + cam.d;
         d.Normalize();

         Ray ray(cam.o, d);
         double t; int id;
         if(!Intersect(spheres, ray, t, id)){ continue; }
         Vector hitp = ray.o + t*ray.d;

         for(auto& elem : _filter_elems) {
            const auto& p = elem.first;
            const auto  x = Vector::Norm(hitp-p) / filterRadius;
            _r += (0.3989422804f/filterRadius) * exp(-0.5f * pow(x, 2)) * elem.second.x;
         }

         const auto scale = 20.f;
         const auto Nold  = nPassesFilter * samps;
         const auto Nnew  = (nPassesFilter+1) * samps;
         ref_img[i] = (ref_img[i]*Nold + scale*_r) / float(Nnew);
         max_temp   = std::max(ref_img[i], max_temp);
      }

      #pragma omp critical
      {
         max_ref = std::max(max_ref, max_temp);
      }
   }

   // Update the scaling
   ref_scale = 1.0f/max_ref;

   // Progressive refinement of the radius and number of passes
   filterRadius *= sqrt((nPassesFilter + 0.8) / (nPassesFilter + 1.0));
   ++nPassesFilter;
}